

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

uint32_t cpu_lduw_code_mips64(CPUArchState_conflict10 *env,abi_ptr addr)

{
  uint idx;
  TCGMemOpIdx oi_00;
  uint64_t uVar1;
  TCGMemOpIdx oi;
  abi_ptr addr_local;
  CPUArchState_conflict10 *env_local;
  
  idx = cpu_mmu_index(env,true);
  oi_00 = make_memop_idx(MO_BEUW,idx);
  uVar1 = full_lduw_code(env,addr,oi_00,0);
  return (uint32_t)uVar1;
}

Assistant:

uint32_t cpu_lduw_code(CPUArchState *env, abi_ptr addr)
{
    TCGMemOpIdx oi = make_memop_idx(MO_TEUW, cpu_mmu_index(env, true));
    return full_lduw_code(env, addr, oi, 0);
}